

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  Pair *__dest;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  long lVar8;
  int iVar9;
  Pair *pPVar10;
  long lVar11;
  ulong uVar6;
  
  iVar2 = (this->Data).Size;
  uVar3 = (ulong)iVar2;
  __dest = (this->Data).Data;
  uVar6 = uVar3;
  pPVar10 = __dest;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    do {
      uVar5 = uVar6 >> 1;
      uVar7 = uVar5;
      if (pPVar10[uVar5].key < key) {
        uVar7 = ~uVar5 + uVar6;
        pPVar10 = pPVar10 + uVar5 + 1;
      }
      uVar6 = uVar7;
    } while (uVar7 != 0);
  }
  if ((pPVar10 == __dest + uVar3) || (pPVar10->key != key)) {
    lVar11 = (long)pPVar10 - (long)__dest;
    if (iVar2 == (this->Data).Capacity) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar4) {
        iVar9 = iVar4;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (Pair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData);
      pPVar10 = (this->Data).Data;
      if (pPVar10 != (Pair *)0x0) {
        memcpy(__dest,pPVar10,(long)(this->Data).Size << 4);
        pPVar10 = (this->Data).Data;
        if ((pPVar10 != (Pair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pPVar10,GImAllocatorUserData);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar9;
      uVar3 = (ulong)(this->Data).Size;
    }
    lVar8 = uVar3 - (lVar11 >> 4);
    if (lVar8 != 0 && lVar11 >> 4 <= (long)uVar3) {
      memmove((void *)((long)__dest + lVar11 + 0x10),(void *)((long)__dest + lVar11),lVar8 * 0x10);
      __dest = (this->Data).Data;
    }
    *(ImGuiID *)((long)__dest + lVar11) = key;
    *(int *)((long)__dest + lVar11 + 8) = val;
    (this->Data).Size = (this->Data).Size + 1;
  }
  else {
    (pPVar10->field_1).val_i = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_i = val;
}